

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O3

shared_ptr<duckdb::MultiFileList,_true> __thiscall
duckdb::MultiFileReader::CreateFileList
          (MultiFileReader *this,ClientContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *paths,FileGlobOptions options)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  GlobMultiFileList *this_00;
  pointer pGVar4;
  IOException *this_01;
  undefined7 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  FileGlobOptions in_R8B;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  shared_ptr<duckdb::MultiFileList,_true> sVar5;
  vector<duckdb::OpenFileInfo,_true> open_files;
  _Head_base<0UL,_duckdb::GlobMultiFileList_*,_false> local_a0;
  vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> local_98;
  undefined1 local_78 [32];
  ClientContext *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __args = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            CONCAT71(in_register_00000009,options);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long *)CONCAT71(in_register_00000009,options))[1];
  local_58 = context;
  if (__args != pbVar1) {
    do {
      ::std::vector<duckdb::OpenFileInfo,std::allocator<duckdb::OpenFileInfo>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<duckdb::OpenFileInfo,std::allocator<duckdb::OpenFileInfo>> *)&local_98,
                 __args);
      __args = __args + 1;
    } while (__args != pbVar1);
  }
  this_00 = (GlobMultiFileList *)operator_new(0x78);
  local_78._0_8_ =
       local_98.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_78._8_8_ =
       local_98.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_78._16_8_ =
       local_98.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GlobMultiFileList::GlobMultiFileList
            (this_00,(ClientContext *)paths,(vector<duckdb::OpenFileInfo,_true> *)local_78,in_R8B);
  local_a0._M_head_impl = this_00;
  std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
            ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)local_78);
  pGVar4 = unique_ptr<duckdb::GlobMultiFileList,_std::default_delete<duckdb::GlobMultiFileList>,_true>
           ::operator->((unique_ptr<duckdb::GlobMultiFileList,_std::default_delete<duckdb::GlobMultiFileList>,_true>
                         *)&local_a0);
  iVar3 = (*(pGVar4->super_MultiFileList)._vptr_MultiFileList[5])(pGVar4);
  if ((char)iVar3 != '\0' || in_R8B != DISALLOW_EMPTY) {
    ::std::__shared_ptr<duckdb::MultiFileList,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<duckdb::GlobMultiFileList,std::default_delete<duckdb::GlobMultiFileList>,void>
              ((__shared_ptr<duckdb::MultiFileList,(__gnu_cxx::_Lock_policy)2> *)this,
               (unique_ptr<duckdb::GlobMultiFileList,_std::default_delete<duckdb::GlobMultiFileList>_>
                *)&local_a0);
    if (local_a0._M_head_impl != (GlobMultiFileList *)0x0) {
      (*((local_a0._M_head_impl)->super_MultiFileList)._vptr_MultiFileList[1])();
    }
    std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector(&local_98);
    sVar5.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = extraout_RDX._M_pi;
    sVar5.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<duckdb::MultiFileList,_true>)
           sVar5.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_01 = (IOException *)__cxa_allocate_exception(0x10);
  local_78._0_8_ = local_78 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"%s needs at least one file to read","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  p_Var2 = (local_58->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
           super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,p_Var2,
             (long)&p_Var2->_vptr__Sp_counted_base +
             (long)(local_58->db).internal.
                   super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  IOException::IOException<std::__cxx11::string>(this_01,(string *)local_78,&local_50);
  __cxa_throw(this_01,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

shared_ptr<MultiFileList> MultiFileReader::CreateFileList(ClientContext &context, const vector<string> &paths,
                                                          FileGlobOptions options) {
	vector<OpenFileInfo> open_files;
	for (auto &path : paths) {
		open_files.emplace_back(path);
	}
	auto res = make_uniq<GlobMultiFileList>(context, std::move(open_files), options);
	if (res->GetExpandResult() == FileExpandResult::NO_FILES && options == FileGlobOptions::DISALLOW_EMPTY) {
		throw IOException("%s needs at least one file to read", function_name);
	}
	return std::move(res);
}